

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteAnimationsLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t a;
  ulong pIndex;
  
  if (this->mScene->mNumAnimations != 0) {
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<library_animations>");
    std::operator<<(poVar1,(string *)&this->endstr);
    PushTag(this);
    for (pIndex = 0; pIndex < this->mScene->mNumAnimations; pIndex = pIndex + 1) {
      WriteAnimationLibrary(this,pIndex);
    }
    PopTag(this);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"</library_animations>");
    std::operator<<(poVar1,(string *)&this->endstr);
    return;
  }
  return;
}

Assistant:

void ColladaExporter::WriteAnimationsLibrary()
{
	if ( mScene->mNumAnimations > 0 ) {
		mOutput << startstr << "<library_animations>" << endstr;
		PushTag();
		
		// start recursive write at the root node
		for( size_t a = 0; a < mScene->mNumAnimations; ++a)
			WriteAnimationLibrary( a );

		PopTag();
		mOutput << startstr << "</library_animations>" << endstr;
	}
}